

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::Runner2::makeReporter(Runner2 *this)

{
  ConfigData *pCVar1;
  int iVar2;
  undefined4 extraout_var;
  IRegistryHub *pIVar3;
  undefined4 extraout_var_00;
  IReporter *p;
  ostream *poVar4;
  domain_error *this_00;
  string reporterName;
  string local_2a0 [32];
  ReporterConfig reporterConfig;
  ostringstream oss;
  
  if ((this->m_config->reporter)._M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&reporterName,"basic",(allocator<char> *)&oss);
  }
  else {
    std::__cxx11::string::string((string *)&reporterName,(string *)this->m_config);
  }
  pCVar1 = this->m_config;
  iVar2 = (*(this->m_configWrapper->super_IConfig)._vptr_IConfig[4])();
  ReporterConfig::ReporterConfig
            (&reporterConfig,&pCVar1->name,(ostream *)CONCAT44(extraout_var,iVar2),
             this->m_config->includeWhichResults == SuccessfulResults,this->m_config);
  pIVar3 = getRegistryHub();
  iVar2 = (*pIVar3->_vptr_IRegistryHub[2])(pIVar3);
  p = (IReporter *)
      (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x10))
                ((long *)CONCAT44(extraout_var_00,iVar2),&reporterName,&reporterConfig);
  Ptr<Catch::IReporter>::operator=(&this->m_reporter,p);
  if ((this->m_reporter).m_p != (IReporter *)0x0) {
    ReporterConfig::~ReporterConfig(&reporterConfig);
    std::__cxx11::string::~string((string *)&reporterName);
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar4 = std::operator<<((ostream *)&oss,"No reporter registered with name: \'");
  poVar4 = std::operator<<(poVar4,(string *)&reporterName);
  std::operator<<(poVar4,"\'");
  this_00 = (domain_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::domain_error::domain_error(this_00,local_2a0);
  __cxa_throw(this_00,&std::domain_error::typeinfo,std::domain_error::~domain_error);
}

Assistant:

void makeReporter() {
            std::string reporterName = m_config.reporter.empty()
            ? "basic"
            : m_config.reporter;

            ReporterConfig reporterConfig( m_config.name, m_configWrapper.stream(), m_config.includeWhichResults == Include::SuccessfulResults, m_config );

            m_reporter = getRegistryHub().getReporterRegistry().create( reporterName, reporterConfig );
            if( !m_reporter ) {
                std::ostringstream oss;
                oss << "No reporter registered with name: '" << reporterName << "'";
                throw std::domain_error( oss.str() );
            }
        }